

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O0

base_learner * cbifyldf_setup(options_i *options,vw *all)

{
  parser *ppVar1;
  undefined *puVar2;
  undefined *puVar3;
  undefined *puVar4;
  undefined *puVar5;
  undefined *puVar6;
  undefined *puVar7;
  undefined *puVar8;
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar9;
  byte bVar10;
  uint64_t uVar11;
  pointer pcVar12;
  float *pfVar13;
  multi_learner *predict;
  vw *pvVar14;
  vw *in_RSI;
  int iVar15;
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *in_RDI;
  learner<cbify,_std::vector<example_*,_std::allocator<example_*>_>_> *l;
  multi_learner *base;
  stringstream ss;
  option_group_definition new_options;
  bool cbify_ldf_option;
  free_ptr<cbify> data;
  string *in_stack_fffffffffffff7e8;
  float __val;
  vw *in_stack_fffffffffffff7f0;
  string *in_stack_fffffffffffff7f8;
  typed_option<float> *in_stack_fffffffffffff800;
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *in_stack_fffffffffffff808;
  allocator *in_stack_fffffffffffff810;
  undefined4 in_stack_fffffffffffff820;
  float fVar16;
  undefined4 in_stack_fffffffffffff824;
  float fVar17;
  size_t in_stack_fffffffffffff828;
  undefined4 in_stack_fffffffffffff830;
  undefined4 in_stack_fffffffffffff834;
  typed_option<float> *in_stack_fffffffffffff838;
  undefined1 *this;
  undefined4 in_stack_fffffffffffff840;
  undefined4 in_stack_fffffffffffff844;
  uint uVar18;
  string local_6a0 [39];
  allocator local_679;
  string local_678 [32];
  float local_658;
  float local_654;
  learner<char,_char> *in_stack_fffffffffffff9b0;
  undefined1 local_640 [383];
  allocator local_4c1;
  string local_4c0 [32];
  string local_4a0 [39];
  allocator local_479;
  string local_478 [32];
  string local_458 [39];
  allocator local_431;
  string local_430 [39];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [32];
  undefined4 local_398;
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [199];
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [199];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  typed_option<bool> local_140;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [63];
  undefined1 local_29;
  undefined1 local_28 [16];
  vw *local_18;
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<cbify>();
  local_29 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Make csoaa_ldf into Contextual Bandit",&local_89);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"cbify_ldf",&local_161);
  VW::config::make_option<bool>(in_stack_fffffffffffff7f8,(bool *)in_stack_fffffffffffff7f0);
  VW::config::typed_option<bool>::keep(&local_140,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_188,"Convert csoaa_ldf into a contextual bandit problem",&local_189);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            ((option_group_definition *)
             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
             (typed_option<bool> *)in_stack_fffffffffffff838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"loss0",&local_251);
  std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
            ((unique_ptr<cbify,_void_(*)(void_*)> *)0x2936df);
  VW::config::make_option<float>(in_stack_fffffffffffff7f8,(float *)in_stack_fffffffffffff7f0);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff800,(float)((ulong)in_stack_fffffffffffff7f8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"loss for correct label",&local_279);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            ((option_group_definition *)
             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),in_stack_fffffffffffff838
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"loss1",&local_341);
  std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
            ((unique_ptr<cbify,_void_(*)(void_*)> *)0x2937c8);
  VW::config::make_option<float>(in_stack_fffffffffffff7f8,(float *)in_stack_fffffffffffff7f0);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff800,(float)((ulong)in_stack_fffffffffffff7f8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"loss for incorrect label",&local_369);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  __val = (float)((ulong)in_stack_fffffffffffff7e8 >> 0x20);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            ((option_group_definition *)
             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),in_stack_fffffffffffff838
            );
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  (*(code *)**(undefined8 **)local_10)(local_10,local_68);
  plVar9 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"cbify_ldf",&local_391);
  bVar10 = (**(code **)(*(long *)plVar9 + 8))(plVar9,local_390);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  if (((bVar10 ^ 0xff) & 1) == 0) {
    uVar11 = uniform_hash((void *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                          in_stack_fffffffffffff828,
                          CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
    pcVar12 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                        ((unique_ptr<cbify,_void_(*)(void_*)> *)0x293d19);
    pvVar14 = local_18;
    pcVar12->app_seed = uVar11;
    pcVar12 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                        ((unique_ptr<cbify,_void_(*)(void_*)> *)0x293d42);
    pcVar12->all = pvVar14;
    pcVar12 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                        ((unique_ptr<cbify,_void_(*)(void_*)> *)0x293d5b);
    plVar9 = local_10;
    pcVar12->use_adf = true;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b8,"cb_explore_adf",&local_3b9);
    bVar10 = (**(code **)(*(long *)plVar9 + 8))(plVar9,local_3b8);
    std::__cxx11::string::~string(local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    plVar9 = local_10;
    if (((bVar10 ^ 0xff) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e0,"cb_explore_adf",&local_3e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_408,"",&local_409);
      (**(code **)(*(long *)plVar9 + 0x28))(plVar9,local_3e0,local_408);
      std::__cxx11::string::~string(local_408);
      std::allocator<char>::~allocator((allocator<char> *)&local_409);
      std::__cxx11::string::~string(local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    }
    plVar9 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_430,"cb_min_cost",&local_431);
    std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
              ((unique_ptr<cbify,_void_(*)(void_*)> *)0x293fe2);
    std::__cxx11::to_string(__val);
    (**(code **)(*(long *)plVar9 + 0x28))(plVar9,local_430,local_458);
    std::__cxx11::string::~string(local_458);
    std::__cxx11::string::~string(local_430);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    plVar9 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_478,"cb_max_cost",&local_479);
    std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
              ((unique_ptr<cbify,_void_(*)(void_*)> *)0x29408a);
    std::__cxx11::to_string(__val);
    (**(code **)(*(long *)plVar9 + 0x28))(plVar9,local_478,local_4a0);
    std::__cxx11::string::~string(local_4a0);
    std::__cxx11::string::~string(local_478);
    std::allocator<char>::~allocator((allocator<char> *)&local_479);
    plVar9 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c0,"baseline",&local_4c1);
    bVar10 = (**(code **)(*(long *)plVar9 + 8))(plVar9,local_4c0);
    uVar18 = (uint)bVar10 << 0x18;
    std::__cxx11::string::~string(local_4c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
    if ((uVar18 & 0x1000000) != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffff9b0);
      this = local_640;
      iVar15 = (int)local_28;
      std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                ((unique_ptr<cbify,_void_(*)(void_*)> *)0x29418e);
      std::abs(iVar15);
      iVar15 = (int)local_28;
      std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                ((unique_ptr<cbify,_void_(*)(void_*)> *)0x2941bf);
      std::abs(iVar15);
      pfVar13 = std::max<float>(&local_654,&local_658);
      fVar17 = *pfVar13;
      pcVar12 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                          ((unique_ptr<cbify,_void_(*)(void_*)> *)0x294220);
      fVar16 = pcVar12->loss1;
      pcVar12 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                          ((unique_ptr<cbify,_void_(*)(void_*)> *)0x294238);
      std::ostream::operator<<(this,fVar17 / (fVar16 - pcVar12->loss0));
      in_stack_fffffffffffff810 = &local_679;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_678,"lr_multiplier",in_stack_fffffffffffff810);
      std::__cxx11::stringstream::str();
      (**(code **)(*(long *)local_10 + 0x28))(local_10,local_678,local_6a0);
      std::__cxx11::string::~string(local_6a0);
      std::__cxx11::string::~string(local_678);
      std::allocator<char>::~allocator((allocator<char> *)&local_679);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffff9b0);
      in_stack_fffffffffffff808 = local_10;
    }
    in_stack_fffffffffffff800 =
         (typed_option<float> *)
         setup_base((options_i *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
    predict = LEARNER::as_multiline<char,char>(in_stack_fffffffffffff9b0);
    pvVar14 = (vw *)LEARNER::
                    init_learner<cbify,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                              ((free_ptr<cbify> *)in_stack_fffffffffffff810,
                               in_stack_fffffffffffff808,
                               (_func_void_cbify_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                                *)in_stack_fffffffffffff800,
                               (_func_void_cbify_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                                *)predict,(size_t)in_stack_fffffffffffff7f0,(prediction_type_t)__val
                              );
    in_stack_fffffffffffff7f0 = pvVar14;
    LEARNER::learner<cbify,_std::vector<example_*,_std::allocator<example_*>_>_>::set_finish
              ((learner<cbify,_std::vector<example_*,_std::allocator<example_*>_>_> *)
               in_stack_fffffffffffff810,(_func_void_cbify_ptr *)in_stack_fffffffffffff808);
    LEARNER::learner<cbify,_std::vector<example_*,_std::allocator<example_*>_>_>::set_finish_example
              ((learner<cbify,_std::vector<example_*,_std::allocator<example_*>_>_> *)pvVar14,
               finish_multiline_example);
    ppVar1 = local_18->p;
    (ppVar1->lp).label_size = DAT_0049cd68;
    puVar8 = PTR_test_label_0049cd60;
    puVar7 = PTR_weight_0049cd50;
    puVar6 = PTR_delete_label_0049cd48;
    puVar5 = PTR_read_cached_label_0049cd40;
    puVar4 = PTR_cache_label_0049cd38;
    puVar3 = PTR_parse_label_0049cd30;
    puVar2 = COST_SENSITIVE::cs_label;
    (ppVar1->lp).copy_label = (_func_void_void_ptr_void_ptr *)PTR_copy_label_0049cd58;
    (ppVar1->lp).test_label = (_func_bool_void_ptr *)puVar8;
    (ppVar1->lp).delete_label = (_func_void_void_ptr *)puVar6;
    (ppVar1->lp).get_weight = (_func_float_void_ptr *)puVar7;
    (ppVar1->lp).cache_label = (_func_void_void_ptr_io_buf_ptr *)puVar4;
    (ppVar1->lp).read_cached_label = (_func_size_t_shared_data_ptr_void_ptr_io_buf_ptr *)puVar5;
    (ppVar1->lp).default_label = (_func_void_void_ptr *)puVar2;
    (ppVar1->lp).parse_label =
         (_func_void_parser_ptr_shared_data_ptr_void_ptr_v_array<substring>_ptr *)puVar3;
    local_18->delete_prediction = (_func_void_void_ptr *)0x0;
    local_8 = LEARNER::make_base<cbify,std::vector<example*,std::allocator<example*>>>
                        ((learner<cbify,_std::vector<example_*,_std::allocator<example_*>_>_> *)
                         pvVar14);
  }
  else {
    local_8 = (base_learner *)0x0;
  }
  local_398 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff7f0);
  std::unique_ptr<cbify,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<cbify,_void_(*)(void_*)> *)in_stack_fffffffffffff800);
  return local_8;
}

Assistant:

base_learner* cbifyldf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cbify>();
  bool cbify_ldf_option = false;

  option_group_definition new_options("Make csoaa_ldf into Contextual Bandit");
  new_options
      .add(make_option("cbify_ldf", cbify_ldf_option).keep().help("Convert csoaa_ldf into a contextual bandit problem"))
      .add(make_option("loss0", data->loss0).default_value(0.f).help("loss for correct label"))
      .add(make_option("loss1", data->loss1).default_value(1.f).help("loss for incorrect label"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cbify_ldf"))
    return nullptr;

  data->app_seed = uniform_hash("vw", 2, 0);
  data->all = &all;
  data->use_adf=true;

  if (!options.was_supplied("cb_explore_adf"))
  {
    options.insert("cb_explore_adf", "");
  }
  options.insert("cb_min_cost", to_string(data->loss0));
  options.insert("cb_max_cost", to_string(data->loss1));

  if (options.was_supplied("baseline"))
  {
    stringstream ss;
    ss << max<float>(abs(data->loss0), abs(data->loss1)) / (data->loss1 - data->loss0);
    options.insert("lr_multiplier", ss.str());
  }

  multi_learner* base = as_multiline(setup_base(options, all));
  learner<cbify,multi_ex>& l = init_learner(data, base, do_actual_learning_ldf<true>, do_actual_learning_ldf<false>, 1, prediction_type::multiclass);

  l.set_finish(finish);
  l.set_finish_example(finish_multiline_example);
  all.p->lp = COST_SENSITIVE::cs_label;
  all.delete_prediction = nullptr;

  return make_base(l);
}